

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  long lVar5;
  ulong uVar6;
  
  pRVar1 = ref_grid->node;
  *allowed = 0;
  pRVar2 = ref_grid->cell[8];
  if (((-1 < node1) && (pRVar3 = pRVar2->ref_adj, node1 < pRVar3->nnode)) &&
     (lVar5 = (long)pRVar3->first[(uint)node1], lVar5 != -1)) {
    pRVar4 = pRVar3->item + lVar5;
    while( true ) {
      if (0 < pRVar2->node_per) {
        uVar6 = 0;
        do {
          if (pRVar1->ref_mpi->id !=
              pRVar1->part[pRVar2->c2n[(long)pRVar2->size_per * (long)pRVar4->ref + uVar6]]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)pRVar2->node_per != uVar6);
      }
      pRVar4 = pRVar2->ref_adj->item;
      lVar5 = (long)pRVar4[(int)lVar5].next;
      if (lVar5 == -1) break;
      pRVar4 = pRVar4 + lVar5;
    }
  }
  if (((-1 < node0) && (pRVar3 = pRVar2->ref_adj, node0 < pRVar3->nnode)) &&
     (lVar5 = (long)pRVar3->first[(uint)node0], lVar5 != -1)) {
    pRVar4 = pRVar3->item + lVar5;
    while( true ) {
      if (0 < pRVar2->node_per) {
        uVar6 = 0;
        do {
          if (pRVar1->ref_mpi->id !=
              pRVar1->part[pRVar2->c2n[(long)pRVar2->size_per * (long)pRVar4->ref + uVar6]]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)pRVar2->node_per != uVar6);
      }
      pRVar4 = pRVar2->ref_adj->item;
      lVar5 = (long)pRVar4[(int)lVar5].next;
      if (lVar5 == -1) break;
      pRVar4 = pRVar4 + lVar5;
    }
  }
  pRVar2 = ref_grid->cell[3];
  if (((-1 < node1) && (pRVar3 = pRVar2->ref_adj, node1 < pRVar3->nnode)) &&
     (lVar5 = (long)pRVar3->first[(uint)node1], lVar5 != -1)) {
    pRVar4 = pRVar3->item + lVar5;
    while( true ) {
      if (0 < pRVar2->node_per) {
        uVar6 = 0;
        do {
          if (pRVar1->ref_mpi->id !=
              pRVar1->part[pRVar2->c2n[(long)pRVar2->size_per * (long)pRVar4->ref + uVar6]]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)pRVar2->node_per != uVar6);
      }
      pRVar4 = pRVar2->ref_adj->item;
      lVar5 = (long)pRVar4[(int)lVar5].next;
      if (lVar5 == -1) break;
      pRVar4 = pRVar4 + lVar5;
    }
  }
  if (((-1 < node0) && (pRVar3 = pRVar2->ref_adj, node0 < pRVar3->nnode)) &&
     (lVar5 = (long)pRVar3->first[(uint)node0], lVar5 != -1)) {
    pRVar4 = pRVar3->item + lVar5;
    while( true ) {
      if (0 < pRVar2->node_per) {
        uVar6 = 0;
        do {
          if (pRVar1->ref_mpi->id !=
              pRVar1->part[pRVar2->c2n[(long)pRVar2->size_per * (long)pRVar4->ref + uVar6]]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)pRVar2->node_per != uVar6);
      }
      pRVar4 = pRVar2->ref_adj->item;
      lVar5 = (long)pRVar4[(int)lVar5].next;
      if (lVar5 == -1) break;
      pRVar4 = pRVar4 + lVar5;
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_local_cell(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  /* may be able to relax node0 local if geom constraint is o.k. */

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  /* for parallel surf and twod */
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}